

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cc
# Opt level: O1

void brotli::EmitLiterals
               (uint8_t *input,size_t len,uint8_t *depth,uint16_t *bits,size_t *storage_ix,
               uint8_t *storage)

{
  byte bVar1;
  ulong uVar2;
  size_t sVar3;
  
  if (len != 0) {
    sVar3 = 0;
    do {
      bVar1 = depth[input[sVar3]];
      if (bits[input[sVar3]] >> (bVar1 & 0x3f) != 0) {
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/./write_bits.h"
                      ,0x2c,
                      "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)"
                     );
      }
      if (0x38 < bVar1) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/./write_bits.h"
                      ,0x2d,
                      "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)"
                     );
      }
      uVar2 = *storage_ix;
      *(ulong *)(storage + (uVar2 >> 3)) =
           (ulong)bits[input[sVar3]] << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3];
      *storage_ix = bVar1 + uVar2;
      sVar3 = sVar3 + 1;
    } while (len != sVar3);
  }
  return;
}

Assistant:

inline void EmitLiterals(const uint8_t* input, const size_t len,
                         const uint8_t depth[256], const uint16_t bits[256],
                         size_t* storage_ix, uint8_t* storage) {
  for (size_t j = 0; j < len; j++) {
    const uint8_t lit = input[j];
    WriteBits(depth[lit], bits[lit], storage_ix, storage);
  }
}